

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIfCommand.cxx
# Opt level: O0

bool __thiscall
cmIfFunctionBlocker::IsFunctionBlocked
          (cmIfFunctionBlocker *this,cmListFileFunction *lff,cmMakefile *mf,
          cmExecutionStatus *inStatus)

{
  bool bVar1;
  reference lff_00;
  cmake *pcVar2;
  cmListFileContext *pcVar3;
  ulong uVar4;
  bool bVar5;
  undefined1 local_270 [8];
  cmListFileBacktrace bt_2;
  string err;
  undefined1 local_238 [7];
  bool isTrue;
  cmListFileContext local_228;
  undefined1 local_1e0 [8];
  cmConditionEvaluator conditionEvaluator;
  cmListFileContext conditionContext;
  undefined1 local_120 [4];
  MessageType messType;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> expandedArguments;
  string errorString;
  string local_e0;
  undefined1 local_c0 [8];
  cmListFileBacktrace bt_1;
  string local_a8;
  undefined1 local_88 [8];
  cmListFileBacktrace bt;
  cmListFileFunction *func;
  iterator __end4;
  iterator __begin4;
  vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *__range4;
  cmExecutionStatus local_40;
  int scopeDepth;
  cmExecutionStatus status;
  unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_> fb;
  cmExecutionStatus *inStatus_local;
  cmMakefile *mf_local;
  cmListFileFunction *lff_local;
  cmIfFunctionBlocker *this_local;
  
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)lff,
                          "if");
  if (bVar1) {
    this->ScopeDepth = this->ScopeDepth + 1;
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)lff
                            ,"endif");
    if ((bVar1) && (this->ScopeDepth = this->ScopeDepth - 1, this->ScopeDepth == 0)) {
      cmMakefile::RemoveFunctionBlocker
                ((cmMakefile *)&status,(cmFunctionBlocker *)mf,(cmListFileFunction *)this);
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&status);
      if (bVar1) {
        cmExecutionStatus::cmExecutionStatus(&local_40);
        __range4._4_4_ = 0;
        __end4 = std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::begin
                           (&this->Functions);
        func = (cmListFileFunction *)
               std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::end
                         (&this->Functions);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end4,(__normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
                                           *)&func), bVar1) {
          lff_00 = __gnu_cxx::
                   __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
                   ::operator*(&__end4);
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)lff_00,"if");
          if (bVar1) {
            __range4._4_4_ = __range4._4_4_ + 1;
          }
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)lff_00,"endif");
          if (bVar1) {
            __range4._4_4_ = __range4._4_4_ + -1;
          }
          if ((__range4._4_4_ == 0) &&
             (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)lff_00,"else"), bVar1)) {
            if ((this->ElseSeen & 1U) != 0) {
              cmMakefile::GetBacktrace((cmMakefile *)local_88,(cmCommandContext *)mf);
              pcVar2 = cmMakefile::GetCMakeInstance(mf);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_a8,
                         "A duplicate ELSE command was found inside an IF block.",
                         (allocator<char> *)
                         ((long)&bt_1.TopEntry.
                                 super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi + 7));
              cmake::IssueMessage(pcVar2,FATAL_ERROR,&local_a8,(cmListFileBacktrace *)local_88);
              std::__cxx11::string::~string((string *)&local_a8);
              std::allocator<char>::~allocator
                        ((allocator<char> *)
                         ((long)&bt_1.TopEntry.
                                 super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi + 7));
              cmSystemTools::SetFatalErrorOccured();
              this_local._7_1_ = 1;
              scopeDepth = 1;
              cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_88);
              goto LAB_003105b0;
            }
            this->IsBlocking = (bool)(this->HasRun & 1);
            this->HasRun = true;
            this->ElseSeen = true;
            if ((this->IsBlocking & 1U) == 0) {
              pcVar2 = cmMakefile::GetCMakeInstance(mf);
              bVar1 = cmake::GetTrace(pcVar2);
              if (bVar1) {
                cmMakefile::PrintCommandTrace(mf,lff_00);
              }
            }
          }
          else if ((__range4._4_4_ == 0) &&
                  (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)lff_00,"elseif"), bVar1)) {
            if ((this->ElseSeen & 1U) != 0) {
              cmMakefile::GetBacktrace((cmMakefile *)local_c0,(cmCommandContext *)mf);
              pcVar2 = cmMakefile::GetCMakeInstance(mf);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_e0,"An ELSEIF command was found after an ELSE command.",
                         (allocator<char> *)(errorString.field_2._M_local_buf + 0xf));
              cmake::IssueMessage(pcVar2,FATAL_ERROR,&local_e0,(cmListFileBacktrace *)local_c0);
              std::__cxx11::string::~string((string *)&local_e0);
              std::allocator<char>::~allocator
                        ((allocator<char> *)(errorString.field_2._M_local_buf + 0xf));
              cmSystemTools::SetFatalErrorOccured();
              this_local._7_1_ = 1;
              scopeDepth = 1;
              cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_c0);
              goto LAB_003105b0;
            }
            if ((this->HasRun & 1U) != 0) {
              this->IsBlocking = true;
              goto LAB_00310595;
            }
            pcVar2 = cmMakefile::GetCMakeInstance(mf);
            bVar1 = cmake::GetTrace(pcVar2);
            if (bVar1) {
              cmMakefile::PrintCommandTrace(mf,lff_00);
            }
            std::__cxx11::string::string
                      ((string *)
                       &expandedArguments.
                        super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
            vector((vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
                   local_120);
            cmMakefile::ExpandArguments
                      (mf,&lff_00->Arguments,
                       (vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                        *)local_120,(char *)0x0);
            pcVar3 = cmFunctionBlocker::GetStartingContext(&this->super_cmFunctionBlocker);
            cmListFileContext::FromCommandContext
                      ((cmListFileContext *)&conditionEvaluator.Policy57Status,
                       &lff_00->super_cmCommandContext,&pcVar3->FilePath);
            cmListFileContext::cmListFileContext
                      (&local_228,(cmListFileContext *)&conditionEvaluator.Policy57Status);
            cmMakefile::GetBacktrace((cmMakefile *)local_238,(cmCommandContext *)mf);
            cmConditionEvaluator::cmConditionEvaluator
                      ((cmConditionEvaluator *)local_1e0,mf,&local_228,
                       (cmListFileBacktrace *)local_238);
            cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_238);
            cmListFileContext::~cmListFileContext(&local_228);
            bVar1 = cmConditionEvaluator::IsTrue
                              ((cmConditionEvaluator *)local_1e0,
                               (vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                                *)local_120,
                               (string *)
                               &expandedArguments.
                                super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (MessageType *)((long)&conditionContext.Line + 4));
            uVar4 = std::__cxx11::string::empty();
            if ((uVar4 & 1) == 0) {
              cmIfCommandError_abi_cxx11_
                        ((string *)
                         &bt_2.TopEntry.
                          super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount,
                         (vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                          *)local_120);
              std::__cxx11::string::operator+=
                        ((string *)
                         &bt_2.TopEntry.
                          super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount,
                         (string *)
                         &expandedArguments.
                          super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              cmMakefile::GetBacktrace((cmMakefile *)local_270,(cmCommandContext *)mf);
              pcVar2 = cmMakefile::GetCMakeInstance(mf);
              cmake::IssueMessage(pcVar2,conditionContext.Line._4_4_,
                                  (string *)
                                  &bt_2.TopEntry.
                                   super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount,(cmListFileBacktrace *)local_270);
              bVar5 = conditionContext.Line._4_4_ == FATAL_ERROR;
              if (bVar5) {
                cmSystemTools::SetFatalErrorOccured();
                this_local._7_1_ = 1;
              }
              scopeDepth = (int)bVar5;
              cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_270);
              std::__cxx11::string::~string
                        ((string *)
                         &bt_2.TopEntry.
                          super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount);
              if (scopeDepth == 0) goto LAB_0031041d;
            }
            else {
LAB_0031041d:
              if (bVar1) {
                this->IsBlocking = false;
                this->HasRun = true;
              }
              scopeDepth = 0;
            }
            cmConditionEvaluator::~cmConditionEvaluator((cmConditionEvaluator *)local_1e0);
            cmListFileContext::~cmListFileContext
                      ((cmListFileContext *)&conditionEvaluator.Policy57Status);
            std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
            ~vector((vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *
                    )local_120);
            std::__cxx11::string::~string
                      ((string *)
                       &expandedArguments.
                        super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            if (scopeDepth != 0) goto LAB_003105b0;
          }
          else if ((this->IsBlocking & 1U) == 0) {
            cmExecutionStatus::Clear(&local_40);
            cmMakefile::ExecuteCommand(mf,lff_00,&local_40);
            bVar1 = cmExecutionStatus::GetReturnInvoked(&local_40);
            if (bVar1) {
              cmExecutionStatus::SetReturnInvoked(inStatus);
              this_local._7_1_ = 1;
              scopeDepth = 1;
              goto LAB_003105b0;
            }
            bVar1 = cmExecutionStatus::GetBreakInvoked(&local_40);
            if (bVar1) {
              cmExecutionStatus::SetBreakInvoked(inStatus);
              this_local._7_1_ = 1;
              scopeDepth = 1;
              goto LAB_003105b0;
            }
            bVar1 = cmExecutionStatus::GetContinueInvoked(&local_40);
            if (bVar1) {
              cmExecutionStatus::SetContinueInvoked(inStatus);
              this_local._7_1_ = 1;
              scopeDepth = 1;
              goto LAB_003105b0;
            }
          }
LAB_00310595:
          __gnu_cxx::
          __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
          ::operator++(&__end4);
        }
        this_local._7_1_ = 1;
        scopeDepth = 1;
      }
      else {
        this_local._7_1_ = 0;
        scopeDepth = 1;
      }
LAB_003105b0:
      std::unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>::~unique_ptr
                ((unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_> *)&status);
      goto LAB_003105e2;
    }
  }
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::push_back
            (&this->Functions,lff);
  this_local._7_1_ = 1;
LAB_003105e2:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmIfFunctionBlocker::IsFunctionBlocked(const cmListFileFunction& lff,
                                            cmMakefile& mf,
                                            cmExecutionStatus& inStatus)
{
  // we start by recording all the functions
  if (lff.Name.Lower == "if") {
    this->ScopeDepth++;
  } else if (lff.Name.Lower == "endif") {
    this->ScopeDepth--;
    // if this is the endif for this if statement, then start executing
    if (!this->ScopeDepth) {
      // Remove the function blocker for this scope or bail.
      std::unique_ptr<cmFunctionBlocker> fb(
        mf.RemoveFunctionBlocker(this, lff));
      if (!fb) {
        return false;
      }

      // execute the functions for the true parts of the if statement
      cmExecutionStatus status;
      int scopeDepth = 0;
      for (cmListFileFunction const& func : this->Functions) {
        // keep track of scope depth
        if (func.Name.Lower == "if") {
          scopeDepth++;
        }
        if (func.Name.Lower == "endif") {
          scopeDepth--;
        }
        // watch for our state change
        if (scopeDepth == 0 && func.Name.Lower == "else") {

          if (this->ElseSeen) {
            cmListFileBacktrace bt = mf.GetBacktrace(func);
            mf.GetCMakeInstance()->IssueMessage(
              MessageType::FATAL_ERROR,
              "A duplicate ELSE command was found inside an IF block.", bt);
            cmSystemTools::SetFatalErrorOccured();
            return true;
          }

          this->IsBlocking = this->HasRun;
          this->HasRun = true;
          this->ElseSeen = true;

          // if trace is enabled, print a (trivially) evaluated "else"
          // statement
          if (!this->IsBlocking && mf.GetCMakeInstance()->GetTrace()) {
            mf.PrintCommandTrace(func);
          }
        } else if (scopeDepth == 0 && func.Name.Lower == "elseif") {
          if (this->ElseSeen) {
            cmListFileBacktrace bt = mf.GetBacktrace(func);
            mf.GetCMakeInstance()->IssueMessage(
              MessageType::FATAL_ERROR,
              "An ELSEIF command was found after an ELSE command.", bt);
            cmSystemTools::SetFatalErrorOccured();
            return true;
          }

          if (this->HasRun) {
            this->IsBlocking = true;
          } else {
            // if trace is enabled, print the evaluated "elseif" statement
            if (mf.GetCMakeInstance()->GetTrace()) {
              mf.PrintCommandTrace(func);
            }

            std::string errorString;

            std::vector<cmExpandedCommandArgument> expandedArguments;
            mf.ExpandArguments(func.Arguments, expandedArguments);

            MessageType messType;

            cmListFileContext conditionContext =
              cmListFileContext::FromCommandContext(
                func, this->GetStartingContext().FilePath);

            cmConditionEvaluator conditionEvaluator(mf, conditionContext,
                                                    mf.GetBacktrace(func));

            bool isTrue = conditionEvaluator.IsTrue(expandedArguments,
                                                    errorString, messType);

            if (!errorString.empty()) {
              std::string err = cmIfCommandError(expandedArguments);
              err += errorString;
              cmListFileBacktrace bt = mf.GetBacktrace(func);
              mf.GetCMakeInstance()->IssueMessage(messType, err, bt);
              if (messType == MessageType::FATAL_ERROR) {
                cmSystemTools::SetFatalErrorOccured();
                return true;
              }
            }

            if (isTrue) {
              this->IsBlocking = false;
              this->HasRun = true;
            }
          }
        }

        // should we execute?
        else if (!this->IsBlocking) {
          status.Clear();
          mf.ExecuteCommand(func, status);
          if (status.GetReturnInvoked()) {
            inStatus.SetReturnInvoked();
            return true;
          }
          if (status.GetBreakInvoked()) {
            inStatus.SetBreakInvoked();
            return true;
          }
          if (status.GetContinueInvoked()) {
            inStatus.SetContinueInvoked();
            return true;
          }
        }
      }
      return true;
    }
  }

  // record the command
  this->Functions.push_back(lff);

  // always return true
  return true;
}